

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

ScalarFunctionSet *
duckdb::GetGenericTimePartFunction
          (ScalarFunctionSet *__return_storage_ptr__,LogicalType *result_type,
          scalar_function_t *date_func,scalar_function_t *ts_func,scalar_function_t *interval_func,
          scalar_function_t *time_func,scalar_function_t timetz_func,
          function_statistics_t date_stats,function_statistics_t ts_stats,
          function_statistics_t time_stats,function_statistics_t timetz_stats)

{
  vector<duckdb::ScalarFunction,_true> *this;
  _Manager_type p_Var1;
  code *pcVar2;
  LogicalType varargs;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  undefined4 uVar3;
  undefined4 uVar4;
  FunctionNullHandling in_stack_fffffffffffff7c8;
  allocator_type local_831;
  bind_lambda_function_t in_stack_fffffffffffff7d0;
  _Any_data local_808;
  code *local_7f8;
  undefined8 local_7f0;
  _Any_data local_7e8;
  _Manager_type local_7d8;
  _Invoker_type local_7d0;
  _Any_data local_7c8;
  _Manager_type local_7b8;
  _Invoker_type local_7b0;
  _Any_data local_7a8;
  _Manager_type local_798;
  _Invoker_type local_790;
  _Any_data local_788;
  _Manager_type local_778;
  _Invoker_type local_770;
  LogicalType local_760;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_748;
  LogicalType local_730;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_718;
  LogicalType local_700;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6e8;
  LogicalType local_6d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6b8;
  LogicalType local_6a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_688;
  LogicalType local_670;
  LogicalType local_658;
  LogicalType local_640;
  LogicalType local_628;
  LogicalType local_610;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(__return_storage_ptr__);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff7d0,DATE);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffff7d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_688,__l,&local_831);
  LogicalType::LogicalType(&local_6a0,result_type);
  local_788._M_unused._M_object = (void *)0x0;
  local_788._8_8_ = 0;
  local_778 = (_Manager_type)0x0;
  local_770 = date_func->_M_invoker;
  p_Var1 = (date_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_788._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(date_func->super__Function_base)._M_functor;
    local_788._8_8_ = *(undefined8 *)((long)&(date_func->super__Function_base)._M_functor + 8);
    (date_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    date_func->_M_invoker = (_Invoker_type)0x0;
    local_778 = p_Var1;
  }
  LogicalType::LogicalType(&local_610,INVALID);
  ScalarFunction::ScalarFunction
            (&local_158,(vector<duckdb::LogicalType,_true> *)&local_688,&local_6a0,
             (scalar_function_t *)&local_788,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,
             (function_statistics_t)timetz_func.super__Function_base._M_functor._8_8_,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_610),CONSISTENT,
             in_stack_fffffffffffff7c8,in_stack_fffffffffffff7d0);
  this = &(__return_storage_ptr__->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_610);
  if (local_778 != (_Manager_type)0x0) {
    (*local_778)(&local_788,&local_788,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_6a0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_688);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff7d0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff7d0,TIMESTAMP);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stack0xfffffffffffff7d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6b8,__l_00,&local_831);
  LogicalType::LogicalType(&local_6d0,result_type);
  local_7a8._M_unused._M_object = (void *)0x0;
  local_7a8._8_8_ = 0;
  local_798 = (_Manager_type)0x0;
  local_790 = ts_func->_M_invoker;
  p_Var1 = (ts_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_7a8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(ts_func->super__Function_base)._M_functor;
    local_7a8._8_8_ = *(undefined8 *)((long)&(ts_func->super__Function_base)._M_functor + 8);
    (ts_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    ts_func->_M_invoker = (_Invoker_type)0x0;
    local_798 = p_Var1;
  }
  LogicalType::LogicalType(&local_628,INVALID);
  uVar4 = 0;
  uVar3 = 0;
  ScalarFunction::ScalarFunction
            (&local_280,(vector<duckdb::LogicalType,_true> *)&local_6b8,&local_6d0,
             (scalar_function_t *)&local_7a8,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,
             (function_statistics_t)timetz_func.super__Function_base._M_manager,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_628),CONSISTENT,
             in_stack_fffffffffffff7c8,in_stack_fffffffffffff7d0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_628);
  if (local_798 != (_Manager_type)0x0) {
    (*local_798)(&local_7a8,&local_7a8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_6d0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6b8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff7d0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff7d0,INTERVAL);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&stack0xfffffffffffff7d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6e8,__l_01,&local_831);
  LogicalType::LogicalType(&local_700,result_type);
  local_7c8._M_unused._M_object = (void *)0x0;
  local_7c8._8_8_ = 0;
  local_7b8 = (_Manager_type)0x0;
  local_7b0 = interval_func->_M_invoker;
  p_Var1 = (interval_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_7c8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(interval_func->super__Function_base)._M_functor;
    local_7c8._8_8_ = *(undefined8 *)((long)&(interval_func->super__Function_base)._M_functor + 8);
    (interval_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    interval_func->_M_invoker = (_Invoker_type)0x0;
    local_7b8 = p_Var1;
  }
  LogicalType::LogicalType(&local_640,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_640;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = uVar3;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = uVar4;
  ScalarFunction::ScalarFunction
            (&local_3a8,(vector<duckdb::LogicalType,_true> *)&local_6e8,&local_700,
             (scalar_function_t *)&local_7c8,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7d0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_3a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_3a8.function,(_Any_data *)&local_3a8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3a8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_640);
  if (local_7b8 != (_Manager_type)0x0) {
    (*local_7b8)(&local_7c8,&local_7c8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_700);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6e8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff7d0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff7d0,TIME);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&stack0xfffffffffffff7d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_718,__l_02,&local_831);
  LogicalType::LogicalType(&local_730,result_type);
  local_7e8._M_unused._M_object = (void *)0x0;
  local_7e8._8_8_ = 0;
  local_7d8 = (_Manager_type)0x0;
  local_7d0 = time_func->_M_invoker;
  p_Var1 = (time_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_7e8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(time_func->super__Function_base)._M_functor;
    local_7e8._8_8_ = *(undefined8 *)((long)&(time_func->super__Function_base)._M_functor + 8);
    (time_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    time_func->_M_invoker = (_Invoker_type)0x0;
    local_7d8 = p_Var1;
  }
  LogicalType::LogicalType(&local_658,INVALID);
  ScalarFunction::ScalarFunction
            (&local_4d0,(vector<duckdb::LogicalType,_true> *)&local_718,&local_730,
             (scalar_function_t *)&local_7e8,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)timetz_func._M_invoker,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_658),CONSISTENT,
             in_stack_fffffffffffff7c8,in_stack_fffffffffffff7d0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  local_4d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_4d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_4d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4d0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_4d0.function,(_Any_data *)&local_4d0.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_4d0.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_658);
  if (local_7d8 != (_Manager_type)0x0) {
    (*local_7d8)(&local_7e8,&local_7e8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_730);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_718);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff7d0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff7d0,TIME_TZ);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&stack0xfffffffffffff7d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_748,__l_03,&local_831);
  LogicalType::LogicalType(&local_760,result_type);
  local_808._M_unused._M_object = (void *)0x0;
  local_808._8_8_ = 0;
  local_7f8 = (code *)0x0;
  local_7f0 = *(undefined8 *)
               (timetz_func.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18);
  pcVar2 = *(code **)(timetz_func.super__Function_base._M_functor._M_unused._M_function_pointer +
                     0x10);
  if (pcVar2 != (code *)0x0) {
    local_808._M_unused._0_8_ =
         (undefined8)*timetz_func.super__Function_base._M_functor._M_unused._M_object;
    local_808._8_8_ =
         *(undefined8 *)
          (timetz_func.super__Function_base._M_functor._M_unused._M_function_pointer + 8);
    *(undefined8 *)
     (timetz_func.super__Function_base._M_functor._M_unused._M_function_pointer + 0x10) = 0;
    *(undefined8 *)
     (timetz_func.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18) = 0;
    local_7f8 = pcVar2;
  }
  LogicalType::LogicalType(&local_670,INVALID);
  ScalarFunction::ScalarFunction
            (&local_5f8,(vector<duckdb::LogicalType,_true> *)&local_748,&local_760,
             (scalar_function_t *)&local_808,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,date_stats,(init_local_state_t)0x0,
             (LogicalType)ZEXT824(&local_670),CONSISTENT,in_stack_fffffffffffff7c8,
             in_stack_fffffffffffff7d0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  local_5f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_5f8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5f8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5f8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5f8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_5f8.function,(_Any_data *)&local_5f8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_5f8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_670);
  if (local_7f8 != (code *)0x0) {
    (*local_7f8)(&local_808,&local_808,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_760);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_748);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff7d0);
  return __return_storage_ptr__;
}

Assistant:

ScalarFunctionSet GetGenericTimePartFunction(const LogicalType &result_type, scalar_function_t date_func,
                                             scalar_function_t ts_func, scalar_function_t interval_func,
                                             scalar_function_t time_func, scalar_function_t timetz_func,
                                             function_statistics_t date_stats, function_statistics_t ts_stats,
                                             function_statistics_t time_stats, function_statistics_t timetz_stats) {
	ScalarFunctionSet operator_set;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::DATE}, result_type, std::move(date_func), nullptr, nullptr, date_stats));
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP}, result_type, std::move(ts_func), nullptr, nullptr, ts_stats));
	operator_set.AddFunction(ScalarFunction({LogicalType::INTERVAL}, result_type, std::move(interval_func)));
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIME}, result_type, std::move(time_func), nullptr, nullptr, time_stats));
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIME_TZ}, result_type, std::move(timetz_func), nullptr, nullptr, timetz_stats));
	return operator_set;
}